

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O0

void __thiscall
fizplex::ColMatrix_AddColumnAndValuesToNonEmptyMatrix_Test::
~ColMatrix_AddColumnAndValuesToNonEmptyMatrix_Test
          (ColMatrix_AddColumnAndValuesToNonEmptyMatrix_Test *this)

{
  void *in_RDI;
  
  ~ColMatrix_AddColumnAndValuesToNonEmptyMatrix_Test
            ((ColMatrix_AddColumnAndValuesToNonEmptyMatrix_Test *)0x1bd588);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(ColMatrix, AddColumnAndValuesToNonEmptyMatrix) {
  ColMatrix m(3, 3,
              {{{0, 7}, {2, -3}, {1, 0.0}},
               {{0, 2}, {1, 3}, {2, 4}},
               {{0, 1}, {1, -1}, {2, -2}}});
  const SVector new_col = {{0, 1.0}, {2, 2.0}, {3, 3.0}};
  m.add_column(new_col);
  EXPECT_EQ(new_col, m.column(3));
}